

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::udf_covar_state_t,double,int,duckdb::UDFCovarPopOperation>
               (double *adata,AggregateInputData *aggr_input_data,int *bdata,
               udf_covar_state_t **states,idx_t count,SelectionVector *asel,SelectionVector *bsel,
               SelectionVector *ssel,ValidityMask *avalidity,ValidityMask *bvalidity)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  idx_t iVar2;
  long in_RCX;
  long in_RDX;
  AggregateInputData *in_RSI;
  long in_RDI;
  ulong in_R8;
  SelectionVector *in_R9;
  idx_t sidx_1;
  idx_t i_1;
  idx_t sidx;
  idx_t i;
  AggregateBinaryInput input;
  idx_t in_stack_ffffffffffffff90;
  ulong idx;
  ulong local_60;
  AggregateBinaryInput local_58;
  SelectionVector *local_30;
  ulong local_28;
  long local_20;
  long local_18;
  long local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  AggregateBinaryInput::AggregateBinaryInput
            (&local_58,in_RSI,(ValidityMask *)i,(ValidityMask *)input.input);
  bVar1 = UDFCovarOperation::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)i), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1)))) {
    for (idx = 0; idx < local_28; idx = idx + 1) {
      local_58.lidx = SelectionVector::get_index(local_30,idx);
      local_58.ridx = SelectionVector::get_index((SelectionVector *)i_1,idx);
      iVar2 = SelectionVector::get_index((SelectionVector *)sidx,idx);
      UDFCovarOperation::
      Operation<double,int,duckdb::udf_covar_state_t,duckdb::UDFCovarPopOperation>
                (*(udf_covar_state_t **)(local_20 + iVar2 * 8),
                 (double *)(local_8 + local_58.lidx * 8),(int *)(local_18 + local_58.ridx * 4),
                 &local_58);
    }
  }
  else {
    for (local_60 = 0; local_60 < local_28; local_60 = local_60 + 1) {
      local_58.lidx = SelectionVector::get_index(local_30,local_60);
      local_58.ridx = SelectionVector::get_index((SelectionVector *)i_1,local_60);
      this = (TemplatedValidityMask<unsigned_long> *)
             SelectionVector::get_index((SelectionVector *)sidx,local_60);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this,in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this,in_stack_ffffffffffffff90),
         bVar1)) {
        UDFCovarOperation::
        Operation<double,int,duckdb::udf_covar_state_t,duckdb::UDFCovarPopOperation>
                  (*(udf_covar_state_t **)(local_20 + (long)this * 8),
                   (double *)(local_8 + local_58.lidx * 8),(int *)(local_18 + local_58.ridx * 4),
                   &local_58);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}